

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_rol_a_clear_neg_retain_c_Test::
CpuTest_rol_a_clear_neg_retain_c_Test(CpuTest_rol_a_clear_neg_retain_c_Test *this)

{
  CpuTest_rol_a_clear_neg_retain_c_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_rol_a_clear_neg_retain_c_Test_003e9b90;
  return;
}

Assistant:

TEST_F(CpuTest, rol_a_clear_neg_retain_c) {
    stage_instruction(ROL_ACC);
    registers.a = 0b10000000;
    registers.p = N_FLAG | C_FLAG;
    expected.a = 0b00000001;
    expected.p = C_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}